

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageFuel.cpp
# Opt level: O2

int __thiscall DIS::StorageFuel::getMarshalledSize(StorageFuel *this)

{
  return 8;
}

Assistant:

int StorageFuel::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _fuelQuantity
   marshalSize = marshalSize + 1;  // _fuelMeasurementUnits
   marshalSize = marshalSize + 1;  // _fuelType
   marshalSize = marshalSize + 1;  // _fuelLocation
   marshalSize = marshalSize + 1;  // _padding
    return marshalSize;
}